

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.cpp
# Opt level: O0

void * boost::(anonymous_namespace)::thread_proxy(void *param)

{
  type ptVar1;
  lock_guard<boost::mutex> lock;
  thread_interrupted *anon_var_0;
  thread_data_ptr thread_info;
  mutex *in_stack_ffffffffffffffb8;
  shared_ptr<boost::detail::thread_data_base> *this;
  condition_variable *in_stack_ffffffffffffffd0;
  element_type *in_stack_ffffffffffffffe8;
  
  this = (shared_ptr<boost::detail::thread_data_base> *)&stack0xffffffffffffffe8;
  enable_shared_from_this<boost::detail::thread_data_base>::shared_from_this
            ((enable_shared_from_this<boost::detail::thread_data_base> *)in_stack_ffffffffffffffe8);
  shared_ptr<boost::detail::thread_data_base>::operator->(this);
  shared_ptr<boost::detail::thread_data_base>::reset
            ((shared_ptr<boost::detail::thread_data_base> *)in_stack_ffffffffffffffd0);
  shared_ptr<boost::detail::thread_data_base>::get(this);
  detail::set_current_thread_data((thread_data_base *)0x2a2fd9);
  ptVar1 = shared_ptr<boost::detail::thread_data_base>::operator->(this);
  (*ptVar1->_vptr_thread_data_base[2])();
  shared_ptr<boost::detail::thread_data_base>::get
            ((shared_ptr<boost::detail::thread_data_base> *)&stack0xffffffffffffffe8);
  detail::(anonymous_namespace)::tls_destructor(thread_info.px);
  detail::set_current_thread_data((thread_data_base *)0x2a305c);
  shared_ptr<boost::detail::thread_data_base>::operator->(this);
  lock_guard<boost::mutex>::lock_guard((lock_guard<boost::mutex> *)this,in_stack_ffffffffffffffb8);
  ptVar1 = shared_ptr<boost::detail::thread_data_base>::operator->(this);
  ptVar1->done = true;
  shared_ptr<boost::detail::thread_data_base>::operator->(this);
  condition_variable::notify_all(in_stack_ffffffffffffffd0);
  lock_guard<boost::mutex>::~lock_guard((lock_guard<boost::mutex> *)0x2a30ac);
  shared_ptr<boost::detail::thread_data_base>::~shared_ptr
            ((shared_ptr<boost::detail::thread_data_base> *)0x2a30b6);
  return (void *)0x0;
}

Assistant:

static void* thread_proxy(void* param)
            {
                //boost::detail::thread_data_ptr thread_info = static_cast<boost::detail::thread_data_base*>(param)->self;
                boost::detail::thread_data_ptr thread_info = static_cast<boost::detail::thread_data_base*>(param)->shared_from_this();
                thread_info->self.reset();
                detail::set_current_thread_data(thread_info.get());
#if defined BOOST_THREAD_PROVIDES_INTERRUPTIONS
                BOOST_TRY
                {
#endif
                    thread_info->run();
#if defined BOOST_THREAD_PROVIDES_INTERRUPTIONS

                }
                BOOST_CATCH (thread_interrupted const&)
                {
                }
// Removed as it stops the debugger identifying the cause of the exception
// Unhandled exceptions still cause the application to terminate
//                 BOOST_CATCH(...)
//                 {
//                   throw;
//
//                     std::terminate();
//                 }
                BOOST_CATCH_END
#endif
                detail::tls_destructor(thread_info.get());
                detail::set_current_thread_data(0);
                boost::lock_guard<boost::mutex> lock(thread_info->data_mutex);
                thread_info->done=true;
                thread_info->done_condition.notify_all();

                return 0;
            }